

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall kj::Canceler::~Canceler(Canceler *this)

{
  bool bVar1;
  StringPtr defaultDescription;
  Exception local_1b0;
  uint local_20;
  Canceler *local_10;
  Canceler *this_local;
  
  local_10 = this;
  bVar1 = isEmpty(this);
  if (!bVar1) {
    defaultDescription = operator____kj("operation canceled",0x12);
    getDestructionReason
              (&local_1b0,END_CANCELER_STACK_START_CANCELEE_STACK,DISCONNECTED,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
               ,0xd4,defaultDescription);
    cancel(this,&local_1b0);
    Exception::~Exception(&local_1b0);
  }
  local_20 = (uint)bVar1;
  AsyncObject::~AsyncObject((AsyncObject *)this);
  return;
}

Assistant:

Canceler::~Canceler() noexcept(false) {
  if (isEmpty()) return;
  cancel(getDestructionReason(
      reinterpret_cast<void*>(&END_CANCELER_STACK_START_CANCELEE_STACK),
      Exception::Type::DISCONNECTED, __FILE__, __LINE__, "operation canceled"_kj));
}